

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

TidyMessageArgument prvTidygetNextMessageArgument(TidyMessageImpl message,TidyIterator *iter)

{
  TidyIterator p_Var1;
  TidyIterator local_30;
  TidyIterator local_20;
  size_t itemIndex;
  size_t item;
  TidyIterator *iter_local;
  
  itemIndex = 0;
  if (iter != (TidyIterator *)0x0) {
    p_Var1 = *iter;
    local_20 = p_Var1;
    if ((p_Var1 != (TidyIterator)0x0) && (p_Var1 <= (TidyIterator)(long)message.argcount)) {
      local_20 = (TidyIterator)((long)&p_Var1->_opaque + 1);
      itemIndex = (size_t)p_Var1;
    }
    if ((TidyIterator)(long)message.argcount < local_20) {
      local_30 = (TidyIterator)0x0;
    }
    else {
      local_30 = local_20;
    }
    *iter = local_30;
    return (TidyMessageArgument)itemIndex;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                ,0x195,
                "TidyMessageArgument prvTidygetNextMessageArgument(TidyMessageImpl, TidyIterator *)"
               );
}

Assistant:

TidyMessageArgument TY_(getNextMessageArgument)( TidyMessageImpl message, TidyIterator* iter )
{
    size_t item = 0;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex >= 1 && itemIndex <= (size_t)message.argcount )
    {
        item = itemIndex;
        itemIndex++;
    }
    
    /* Just as TidyIterator is really just a dumb, one-based index, the
       TidyMessageArgument is really just a dumb, zero-based index; however
       this type of iterator and opaque interrogation is simply how Tidy
       does things. */
    *iter = (TidyIterator)( itemIndex <= (size_t)message.argcount ? itemIndex : (size_t)0 );
    return (TidyMessageArgument)item;
}